

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O2

string * __thiscall
cppwinrt::writer_base<cppwinrt::writer>::
write_temp<std::variant<winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>>
          (string *__return_storage_ptr__,writer_base<cppwinrt::writer> *this,string_view *value,
          variant<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
          *args)

{
  pointer pcVar1;
  pointer pcVar2;
  uint32_t uVar3;
  size_type __new_size;
  
  pcVar1 = (this->m_first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = (this->m_first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar3 = count_placeholders(value);
  if (uVar3 == 1) {
    __new_size = (long)pcVar2 - (long)pcVar1;
    write_segment<std::variant<winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>>
              (this,value,args);
    pcVar1 = (this->m_first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar2 = (this->m_first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar1 + __new_size,pcVar2);
    std::vector<char,_std::allocator<char>_>::resize(&this->m_first,__new_size);
    return __return_storage_ptr__;
  }
  __assert_fail("count_placeholders(value) == sizeof...(Args)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                ,0x32,
                "std::string cppwinrt::writer_base<cppwinrt::writer>::write_temp(const std::string_view &, const Args &...) [T = cppwinrt::writer, Args = <std::variant<winmd::reader::ElementType, winmd::reader::coded_index<winmd::reader::TypeDefOrRef>, winmd::reader::GenericTypeIndex, winmd::reader::GenericTypeInstSig, winmd::reader::GenericMethodTypeIndex>>]"
               );
}

Assistant:

std::string write_temp(std::string_view const& value, Args const&... args)
        {
#if defined(_DEBUG)
            bool restore_debug_trace = debug_trace;
            debug_trace = false;
#endif
            auto const size = m_first.size();

            assert(count_placeholders(value) == sizeof...(Args));
            write_segment(value, args...);

            std::string result{ m_first.data() + size, m_first.size() - size };
            m_first.resize(size);

#if defined(_DEBUG)
            debug_trace = restore_debug_trace;
#endif
            return result;
        }